

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

QSslConfiguration __thiscall QHttpNetworkReply::sslConfiguration(QHttpNetworkReply *this)

{
  long lVar1;
  bool bVar2;
  QSslSocket *pQVar3;
  long in_RSI;
  
  lVar1 = *(long *)(in_RSI + 8);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x178));
  if ((bVar2) &&
     (pQVar3 = QtPrivate::qobject_cast_helper<QSslSocket*,QObject>
                         (*(QObject **)(*(long *)(lVar1 + 0x180) + 0x10)),
     pQVar3 != (QSslSocket *)0x0)) {
    QSslSocket::sslConfiguration((QSslSocket *)this);
    return (QSharedDataPointer<QSslConfigurationPrivate>)
           (QSharedDataPointer<QSslConfigurationPrivate>)this;
  }
  QSslConfiguration::QSslConfiguration((QSslConfiguration *)this);
  return (QSharedDataPointer<QSslConfigurationPrivate>)
         (QSharedDataPointer<QSslConfigurationPrivate>)this;
}

Assistant:

QSslConfiguration QHttpNetworkReply::sslConfiguration() const
{
    Q_D(const QHttpNetworkReply);

    if (!d->connectionChannel)
        return QSslConfiguration();

    QSslSocket *sslSocket = qobject_cast<QSslSocket*>(d->connectionChannel->socket);
    if (!sslSocket)
        return QSslConfiguration();

    return sslSocket->sslConfiguration();
}